

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pageant.c
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  bool bVar2;
  _Bool _Var3;
  int iVar4;
  int iVar5;
  char *pcVar6;
  size_t n;
  char **ppcVar7;
  bool bVar8;
  cmdline_key_action *local_60;
  cmdline_key_action *act;
  _Bool has_lifetime;
  _Bool has_client_actions;
  _Bool has_agent_actions;
  char *passphrase;
  char *keyword;
  char *p;
  FILE *logfp;
  char *symlink_path;
  char *standalone_askpass_prompt;
  keyact curr_keyact;
  _Bool doing_opts;
  char **argv_local;
  int argc_local;
  
  bVar1 = true;
  standalone_askpass_prompt._0_4_ = KEYACT_AGENT_LOAD;
  symlink_path = (char *)0x0;
  logfp = (FILE *)0x0;
  p = (char *)0x0;
  progname = *argv;
  _curr_keyact = argv;
  argv_local._0_4_ = argc;
  while (iVar4 = (int)argv_local + -1, 0 < iVar4) {
    ppcVar7 = _curr_keyact + 1;
    pcVar6 = _curr_keyact[1];
    if ((*pcVar6 == '-') && (bVar1)) {
      iVar5 = strcmp(pcVar6,"-V");
      if ((iVar5 == 0) || (iVar5 = strcmp(pcVar6,"--version"), iVar5 == 0)) {
        version();
        _curr_keyact = ppcVar7;
        argv_local._0_4_ = iVar4;
      }
      else {
        iVar5 = strcmp(pcVar6,"--help");
        if (iVar5 == 0) {
          usage();
          exit(0);
        }
        iVar5 = strcmp(pcVar6,"-v");
        if (iVar5 == 0) {
          p = (char *)_stderr;
          _curr_keyact = ppcVar7;
          argv_local._0_4_ = iVar4;
        }
        else {
          iVar5 = strcmp(pcVar6,"-a");
          if (iVar5 == 0) {
            standalone_askpass_prompt._0_4_ = KEYACT_CLIENT_ADD;
            _curr_keyact = ppcVar7;
            argv_local._0_4_ = iVar4;
          }
          else {
            iVar5 = strcmp(pcVar6,"-d");
            if (iVar5 == 0) {
              standalone_askpass_prompt._0_4_ = KEYACT_CLIENT_DEL;
              _curr_keyact = ppcVar7;
              argv_local._0_4_ = iVar4;
            }
            else {
              iVar5 = strcmp(pcVar6,"-r");
              if (iVar5 == 0) {
                standalone_askpass_prompt._0_4_ = KEYACT_CLIENT_REENCRYPT;
                _curr_keyact = ppcVar7;
                argv_local._0_4_ = iVar4;
              }
              else {
                iVar5 = strcmp(pcVar6,"-s");
                if (iVar5 == 0) {
                  shell_type = ADDRTYPE_IPV4;
                  _curr_keyact = ppcVar7;
                  argv_local._0_4_ = iVar4;
                }
                else {
                  iVar5 = strcmp(pcVar6,"-c");
                  if (iVar5 == 0) {
                    shell_type = ADDRTYPE_IPV6;
                    _curr_keyact = ppcVar7;
                    argv_local._0_4_ = iVar4;
                  }
                  else {
                    iVar5 = strcmp(pcVar6,"-D");
                    if (iVar5 == 0) {
                      add_keyact(KEYACT_CLIENT_DEL_ALL,(char *)0x0);
                      _curr_keyact = ppcVar7;
                      argv_local._0_4_ = iVar4;
                    }
                    else {
                      iVar5 = strcmp(pcVar6,"-R");
                      if (iVar5 == 0) {
                        add_keyact(KEYACT_CLIENT_REENCRYPT_ALL,(char *)0x0);
                        _curr_keyact = ppcVar7;
                        argv_local._0_4_ = iVar4;
                      }
                      else {
                        iVar5 = strcmp(pcVar6,"-l");
                        if (iVar5 == 0) {
                          add_keyact(KEYACT_CLIENT_LIST,(char *)0x0);
                          _curr_keyact = ppcVar7;
                          argv_local._0_4_ = iVar4;
                        }
                        else {
                          iVar5 = strcmp(pcVar6,"--public");
                          if (iVar5 == 0) {
                            standalone_askpass_prompt._0_4_ = KEYACT_CLIENT_PUBLIC;
                            _curr_keyact = ppcVar7;
                            argv_local._0_4_ = iVar4;
                          }
                          else {
                            iVar5 = strcmp(pcVar6,"--public-openssh");
                            if ((iVar5 == 0) || (iVar5 = strcmp(pcVar6,"-L"), iVar5 == 0)) {
                              standalone_askpass_prompt._0_4_ = KEYACT_CLIENT_PUBLIC_OPENSSH;
                              _curr_keyact = ppcVar7;
                              argv_local._0_4_ = iVar4;
                            }
                            else {
                              iVar5 = strcmp(pcVar6,"-X");
                              if (iVar5 == 0) {
                                life = ADDRTYPE_IPV4;
                                _curr_keyact = ppcVar7;
                                argv_local._0_4_ = iVar4;
                              }
                              else {
                                iVar5 = strcmp(pcVar6,"-T");
                                if (iVar5 == 0) {
                                  life = ADDRTYPE_IPV6;
                                  _curr_keyact = ppcVar7;
                                  argv_local._0_4_ = iVar4;
                                }
                                else {
                                  iVar5 = strcmp(pcVar6,"--no-decrypt");
                                  if (((((iVar5 == 0) ||
                                        (iVar5 = strcmp(pcVar6,"-no-decrypt"), iVar5 == 0)) ||
                                       (iVar5 = strcmp(pcVar6,"--no_decrypt"), iVar5 == 0)) ||
                                      ((iVar5 = strcmp(pcVar6,"-no_decrypt"), iVar5 == 0 ||
                                       (iVar5 = strcmp(pcVar6,"--nodecrypt"), iVar5 == 0)))) ||
                                     ((iVar5 = strcmp(pcVar6,"-nodecrypt"), iVar5 == 0 ||
                                      ((iVar5 = strcmp(pcVar6,"--encrypted"), iVar5 == 0 ||
                                       (iVar5 = strcmp(pcVar6,"-encrypted"), iVar5 == 0)))))) {
                                    if ((keyact)standalone_askpass_prompt == KEYACT_AGENT_LOAD) {
                                      standalone_askpass_prompt._0_4_ = KEYACT_AGENT_LOAD_ENCRYPTED;
                                      _curr_keyact = ppcVar7;
                                      argv_local._0_4_ = iVar4;
                                    }
                                    else {
                                      if ((keyact)standalone_askpass_prompt != KEYACT_CLIENT_ADD) {
                                        fprintf(_stderr,
                                                "pageant: unexpected -E while not adding keys\n");
                                        exit(1);
                                      }
                                      standalone_askpass_prompt._0_4_ = KEYACT_CLIENT_ADD_ENCRYPTED;
                                      _curr_keyact = ppcVar7;
                                      argv_local._0_4_ = iVar4;
                                    }
                                  }
                                  else {
                                    iVar5 = strcmp(pcVar6,"--debug");
                                    if (iVar5 == 0) {
                                      life = ADDRTYPE_LOCAL;
                                      _curr_keyact = ppcVar7;
                                      argv_local._0_4_ = iVar4;
                                    }
                                    else {
                                      iVar5 = strcmp(pcVar6,"--test-sign");
                                      if (iVar5 == 0) {
                                        standalone_askpass_prompt._0_4_ = KEYACT_CLIENT_SIGN;
                                        sign_flags = 0;
                                        _curr_keyact = ppcVar7;
                                        argv_local._0_4_ = iVar4;
                                      }
                                      else {
                                        _Var3 = strstartswith(pcVar6,"--test-sign-with-flags=");
                                        if (_Var3) {
                                          standalone_askpass_prompt._0_4_ = KEYACT_CLIENT_SIGN;
                                          sign_flags = atoi(pcVar6 + 0x17);
                                          _curr_keyact = ppcVar7;
                                          argv_local._0_4_ = iVar4;
                                        }
                                        else {
                                          iVar5 = strcmp(pcVar6,"--permanent");
                                          if (iVar5 == 0) {
                                            life = ADDRTYPE_NAME;
                                            _curr_keyact = ppcVar7;
                                            argv_local._0_4_ = iVar4;
                                          }
                                          else {
                                            iVar5 = strcmp(pcVar6,"--exec");
                                            if (iVar5 == 0) {
                                              life = CS_ISO8859_4;
                                              if ((int)argv_local + -2 < 1) {
                                                fprintf(_stderr,
                                                  "pageant: expected a command after --exec\n");
                                                exit(1);
                                              }
                                              exec_args = _curr_keyact + 2;
                                              argv_local._0_4_ = 0;
                                              _curr_keyact = exec_args;
                                            }
                                            else {
                                              iVar5 = strcmp(pcVar6,"--tty-prompt");
                                              if (iVar5 == 0) {
                                                prompt_type = ADDRTYPE_IPV4;
                                                _curr_keyact = ppcVar7;
                                                argv_local._0_4_ = iVar4;
                                              }
                                              else {
                                                iVar5 = strcmp(pcVar6,"--gui-prompt");
                                                if (iVar5 == 0) {
                                                  prompt_type = ADDRTYPE_IPV6;
                                                  _curr_keyact = ppcVar7;
                                                  argv_local._0_4_ = iVar4;
                                                }
                                                else {
                                                  iVar5 = strcmp(pcVar6,"--askpass");
                                                  if (iVar5 == 0) {
                                                    if ((int)argv_local + -2 < 1) {
                                                      fprintf(_stderr,
                                                  "pageant: expected a prompt message after --askpass\n"
                                                  );
                                                  exit(1);
                                                  }
                                                  symlink_path = _curr_keyact[2];
                                                  _curr_keyact = _curr_keyact + 2;
                                                  argv_local._0_4_ = (int)argv_local + -2;
                                                  }
                                                  else {
                                                    iVar5 = strcmp(pcVar6,"--symlink");
                                                    if (iVar5 == 0) {
                                                      if ((int)argv_local + -2 < 1) {
                                                        fprintf(_stderr,
                                                  "pageant: expected a pathname after --symlink\n");
                                                  exit(1);
                                                  }
                                                  logfp = (FILE *)_curr_keyact[2];
                                                  _curr_keyact = _curr_keyact + 2;
                                                  argv_local._0_4_ = (int)argv_local + -2;
                                                  }
                                                  else {
                                                    iVar5 = strcmp(pcVar6,"-E");
                                                    if ((iVar5 == 0) ||
                                                       (iVar5 = strcmp(pcVar6,"--fptype"),
                                                       iVar5 == 0)) {
                                                      argv_local._0_4_ = (int)argv_local + -2;
                                                      if ((int)argv_local < 1) {
                                                        fprintf(_stderr,
                                                  "pageant: expected a type string after %s\n",
                                                  pcVar6);
                                                  exit(1);
                                                  }
                                                  pcVar6 = _curr_keyact[2];
                                                  iVar4 = strcmp(pcVar6,"md5");
                                                  if (iVar4 == 0) {
                                                    key_list_fptype = SSH_FPTYPE_MD5;
                                                    _curr_keyact = _curr_keyact + 2;
                                                  }
                                                  else {
                                                    iVar4 = strcmp(pcVar6,"sha256");
                                                    if (iVar4 != 0) {
                                                      fprintf(_stderr,
                                                  "pageant: unknown fingerprint type `%s\'\n",pcVar6
                                                  );
                                                  exit(1);
                                                  }
                                                  key_list_fptype = SSH_FPTYPE_SHA256;
                                                  _curr_keyact = _curr_keyact + 2;
                                                  }
                                                  }
                                                  else {
                                                    iVar5 = strcmp(pcVar6,"--");
                                                    if (iVar5 != 0) {
                                                      fprintf(_stderr,
                                                  "pageant: unrecognised option \'%s\'\n",pcVar6);
                                                  exit(1);
                                                  }
                                                  bVar1 = false;
                                                  _curr_keyact = ppcVar7;
                                                  argv_local._0_4_ = iVar4;
                                                  }
                                                  }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    else {
      add_keyact((keyact)standalone_askpass_prompt,pcVar6);
      _curr_keyact = ppcVar7;
      argv_local._0_4_ = iVar4;
    }
  }
  if ((life == CS_ISO8859_4) && (exec_args == (char **)0x0)) {
    fprintf(_stderr,"pageant: expected a command with --exec\n");
    exit(1);
  }
  if (((display == (char *)0x0) && (display = getenv("DISPLAY"), display != (char *)0x0)) &&
     (*display == '\0')) {
    display = (char *)0x0;
  }
  if (symlink_path == (char *)0x0) {
    putty_signal(0xd,(_func_void_int *)0x1);
    sk_init();
    uxsel_init();
    bVar2 = false;
    bVar1 = false;
    for (local_60 = keyact_head; local_60 != (cmdline_key_action *)0x0; local_60 = local_60->next) {
      _Var3 = is_agent_action(local_60->action);
      if (_Var3) {
        bVar2 = true;
      }
      else {
        bVar1 = true;
      }
    }
    bVar8 = life != ADDRTYPE_UNSPEC;
    if ((bVar8) && (bVar1)) {
      fprintf(_stderr,
              "pageant: client key actions (-a, -d, -D, -r, -R, -l, -L) do not go with an agent lifetime option\n"
             );
      exit(1);
    }
    if ((!bVar8) && (bVar2)) {
      fprintf(_stderr,"pageant: expected an agent lifetime option with bare key file arguments\n");
      exit(1);
    }
    if ((!bVar8) && (!bVar1)) {
      fprintf(_stderr,"pageant: expected an agent lifetime option or a client key action\n");
      exit(1);
    }
    if (bVar8) {
      run_agent((FILE *)p,(char *)logfp);
    }
    else if (bVar1) {
      run_client();
    }
    argv_local._4_4_ = 0;
  }
  else {
    pcVar6 = askpass(symlink_path);
    if (pcVar6 == (char *)0x0) {
      argv_local._4_4_ = 1;
    }
    else {
      puts(pcVar6);
      fflush(_stdout);
      n = strlen(pcVar6);
      smemclr(pcVar6,n);
      safefree(pcVar6);
      argv_local._4_4_ = 0;
    }
  }
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char **argv)
{
    bool doing_opts = true;
    keyact curr_keyact = KEYACT_AGENT_LOAD;
    const char *standalone_askpass_prompt = NULL;
    const char *symlink_path = NULL;
    FILE *logfp = NULL;

    progname = argv[0];

    /*
     * Process the command line.
     */
    while (--argc > 0) {
        char *p = *++argv;
        if (*p == '-' && doing_opts) {
            if (!strcmp(p, "-V") || !strcmp(p, "--version")) {
                version();
            } else if (!strcmp(p, "--help")) {
                usage();
                exit(0);
            } else if (!strcmp(p, "-v")) {
                logfp = stderr;
            } else if (!strcmp(p, "-a")) {
                curr_keyact = KEYACT_CLIENT_ADD;
            } else if (!strcmp(p, "-d")) {
                curr_keyact = KEYACT_CLIENT_DEL;
            } else if (!strcmp(p, "-r")) {
                curr_keyact = KEYACT_CLIENT_REENCRYPT;
            } else if (!strcmp(p, "-s")) {
                shell_type = SHELL_SH;
            } else if (!strcmp(p, "-c")) {
                shell_type = SHELL_CSH;
            } else if (!strcmp(p, "-D")) {
                add_keyact(KEYACT_CLIENT_DEL_ALL, NULL);
            } else if (!strcmp(p, "-R")) {
                add_keyact(KEYACT_CLIENT_REENCRYPT_ALL, NULL);
            } else if (!strcmp(p, "-l")) {
                add_keyact(KEYACT_CLIENT_LIST, NULL);
            } else if (!strcmp(p, "--public")) {
                curr_keyact = KEYACT_CLIENT_PUBLIC;
            } else if (!strcmp(p, "--public-openssh") || !strcmp(p, "-L")) {
                curr_keyact = KEYACT_CLIENT_PUBLIC_OPENSSH;
            } else if (!strcmp(p, "-X")) {
                life = LIFE_X11;
            } else if (!strcmp(p, "-T")) {
                life = LIFE_TTY;
            } else if (!strcmp(p, "--no-decrypt") ||
                       !strcmp(p, "-no-decrypt") ||
                       !strcmp(p, "--no_decrypt") ||
                       !strcmp(p, "-no_decrypt") ||
                       !strcmp(p, "--nodecrypt") ||
                       !strcmp(p, "-nodecrypt") ||
                       !strcmp(p, "--encrypted") ||
                       !strcmp(p, "-encrypted")) {
                if (curr_keyact == KEYACT_AGENT_LOAD)
                    curr_keyact = KEYACT_AGENT_LOAD_ENCRYPTED;
                else if (curr_keyact == KEYACT_CLIENT_ADD)
                    curr_keyact = KEYACT_CLIENT_ADD_ENCRYPTED;
                else {
                    fprintf(stderr, "pageant: unexpected -E while not adding "
                            "keys\n");
                    exit(1);
                }
            } else if (!strcmp(p, "--debug")) {
                life = LIFE_DEBUG;
            } else if (!strcmp(p, "--test-sign")) {
                curr_keyact = KEYACT_CLIENT_SIGN;
                sign_flags = 0;
            } else if (strstartswith(p, "--test-sign-with-flags=")) {
                curr_keyact = KEYACT_CLIENT_SIGN;
                sign_flags = atoi(p + strlen("--test-sign-with-flags="));
            } else if (!strcmp(p, "--permanent")) {
                life = LIFE_PERM;
            } else if (!strcmp(p, "--exec")) {
                life = LIFE_EXEC;
                /* Now all subsequent arguments go to the exec command. */
                if (--argc > 0) {
                    exec_args = ++argv;
                    argc = 0;          /* force end of option processing */
                } else {
                    fprintf(stderr, "pageant: expected a command "
                            "after --exec\n");
                    exit(1);
                }
            } else if (!strcmp(p, "--tty-prompt")) {
                prompt_type = PROMPT_TTY;
            } else if (!strcmp(p, "--gui-prompt")) {
                prompt_type = PROMPT_GUI;
            } else if (!strcmp(p, "--askpass")) {
                if (--argc > 0) {
                    standalone_askpass_prompt = *++argv;
                } else {
                    fprintf(stderr, "pageant: expected a prompt message "
                            "after --askpass\n");
                    exit(1);
                }
            } else if (!strcmp(p, "--symlink")) {
                if (--argc > 0) {
                    symlink_path = *++argv;
                } else {
                    fprintf(stderr, "pageant: expected a pathname "
                            "after --symlink\n");
                    exit(1);
                }
            } else if (!strcmp(p, "-E") || !strcmp(p, "--fptype")) {
                const char *keyword;
                if (--argc > 0) {
                    keyword = *++argv;
                } else {
                    fprintf(stderr, "pageant: expected a type string "
                            "after %s\n", p);
                    exit(1);
                }
                if (!strcmp(keyword, "md5"))
                    key_list_fptype = SSH_FPTYPE_MD5;
                else if (!strcmp(keyword, "sha256"))
                    key_list_fptype = SSH_FPTYPE_SHA256;
                else {
                    fprintf(stderr, "pageant: unknown fingerprint type `%s'\n",
                            keyword);
                    exit(1);
                }
            } else if (!strcmp(p, "--")) {
                doing_opts = false;
            } else {
                fprintf(stderr, "pageant: unrecognised option '%s'\n", p);
                exit(1);
            }
        } else {
            /*
             * Non-option arguments (apart from those after --exec,
             * which are treated specially above) are interpreted as
             * the names of private key files to either add or delete
             * from an agent.
             */
            add_keyact(curr_keyact, p);
        }
    }

    if (life == LIFE_EXEC && !exec_args) {
        fprintf(stderr, "pageant: expected a command with --exec\n");
        exit(1);
    }

    if (!display) {
        display = getenv("DISPLAY");
        if (display && !*display)
            display = NULL;
    }

    /*
     * Deal with standalone-askpass mode.
     */
    if (standalone_askpass_prompt) {
        char *passphrase = askpass(standalone_askpass_prompt);

        if (!passphrase)
            return 1;

        puts(passphrase);
        fflush(stdout);

        smemclr(passphrase, strlen(passphrase));
        sfree(passphrase);
        return 0;
    }

    /*
     * Block SIGPIPE, so that we'll get EPIPE individually on
     * particular network connections that go wrong.
     */
    putty_signal(SIGPIPE, SIG_IGN);

    sk_init();
    uxsel_init();

    /*
     * Now distinguish our two main running modes. Either we're
     * actually starting up an agent, in which case we should have a
     * lifetime mode, and no key actions of KEYACT_CLIENT_* type; or
     * else we're contacting an existing agent to add or remove keys,
     * in which case we should have no lifetime mode, and no key
     * actions of KEYACT_AGENT_* type.
     */
    {
        bool has_agent_actions = false;
        bool has_client_actions = false;
        bool has_lifetime = false;
        const struct cmdline_key_action *act;

        for (act = keyact_head; act; act = act->next) {
            if (is_agent_action(act->action))
                has_agent_actions = true;
            else
                has_client_actions = true;
        }
        if (life != LIFE_UNSPEC)
            has_lifetime = true;

        if (has_lifetime && has_client_actions) {
            fprintf(stderr, "pageant: client key actions (-a, -d, -D, -r, -R, "
                    "-l, -L) do not go with an agent lifetime option\n");
            exit(1);
        }
        if (!has_lifetime && has_agent_actions) {
            fprintf(stderr, "pageant: expected an agent lifetime option with"
                    " bare key file arguments\n");
            exit(1);
        }
        if (!has_lifetime && !has_client_actions) {
            fprintf(stderr, "pageant: expected an agent lifetime option"
                    " or a client key action\n");
            exit(1);
        }

        if (has_lifetime) {
            run_agent(logfp, symlink_path);
        } else if (has_client_actions) {
            run_client();
        }
    }

    return 0;
}